

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O1

EventLoop * __thiscall
sznet::net::EventLoopThreadPool::getLoopForHash(EventLoopThreadPool *this,size_t hashCode)

{
  EventLoop *this_00;
  pointer ppEVar1;
  pointer ppEVar2;
  bool bVar3;
  
  this_00 = this->m_baseLoop;
  bVar3 = EventLoop::isInLoopThread(this_00);
  if (!bVar3) {
    EventLoop::abortNotInLoopThread(this_00);
  }
  ppEVar1 = (this->m_loops).
            super__Vector_base<sznet::net::EventLoop_*,_std::allocator<sznet::net::EventLoop_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppEVar2 = (this->m_loops).
            super__Vector_base<sznet::net::EventLoop_*,_std::allocator<sznet::net::EventLoop_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar1 != ppEVar2) {
    this = (EventLoopThreadPool *)(ppEVar1 + hashCode % (ulong)((long)ppEVar2 - (long)ppEVar1 >> 3))
    ;
  }
  return this->m_baseLoop;
}

Assistant:

EventLoop* EventLoopThreadPool::getLoopForHash(size_t hashCode)
{
	m_baseLoop->assertInLoopThread();
	EventLoop* loop = m_baseLoop;

	if (!m_loops.empty())
	{
		loop = m_loops[hashCode % m_loops.size()];
	}
	return loop;
}